

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_nw_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [32];
  char cVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  __m256i *ptr;
  __m256i *palVar8;
  __m256i *ptr_00;
  int8_t *ptr_01;
  int iVar9;
  int iVar10;
  int iVar11;
  char cVar12;
  int8_t iVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong size;
  __m256i *palVar23;
  bool bVar24;
  undefined1 uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  __m256i_8_t e;
  __m256i_8_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  undefined1 auVar27 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar2 = (profile->profile8).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar16 = profile->s1Len;
        if ((int)uVar16 < 1) {
          parasail_nw_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_nw_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_striped_profile_avx2_256_8_cold_1();
        }
        else {
          iVar6 = uVar16 - 1;
          size = (ulong)uVar16 + 0x1f >> 5;
          iVar22 = (int)size;
          iVar10 = ppVar3->min;
          iVar9 = -open;
          uVar16 = (uint)(byte)-(char)iVar10;
          if (iVar10 != iVar9 && SBORROW4(iVar10,iVar9) == iVar10 + open < 0) {
            uVar16 = open;
          }
          cVar5 = '~' - (char)ppVar3->max;
          ppVar7 = parasail_result_new();
          if (ppVar7 != (parasail_result_t *)0x0) {
            ppVar7->flag = ppVar7->flag | 0x20100801;
            ptr = parasail_memalign___m256i(0x20,size);
            palVar8 = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign___m256i(0x20,size);
            ptr_01 = parasail_memalign_int8_t(0x20,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m256i *)0x0) &&
                (palVar8 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
              iVar10 = s2Len + -1;
              iVar11 = 0x1f - iVar6 / iVar22;
              uVar25 = (undefined1)open;
              auVar29[1] = uVar25;
              auVar29[0] = uVar25;
              auVar29[2] = uVar25;
              auVar29[3] = uVar25;
              auVar29[4] = uVar25;
              auVar29[5] = uVar25;
              auVar29[6] = uVar25;
              auVar29[7] = uVar25;
              auVar29[8] = uVar25;
              auVar29[9] = uVar25;
              auVar29[10] = uVar25;
              auVar29[0xb] = uVar25;
              auVar29[0xc] = uVar25;
              auVar29[0xd] = uVar25;
              auVar29[0xe] = uVar25;
              auVar29[0xf] = uVar25;
              auVar29[0x10] = uVar25;
              auVar29[0x11] = uVar25;
              auVar29[0x12] = uVar25;
              auVar29[0x13] = uVar25;
              auVar29[0x14] = uVar25;
              auVar29[0x15] = uVar25;
              auVar29[0x16] = uVar25;
              auVar29[0x17] = uVar25;
              auVar29[0x18] = uVar25;
              auVar29[0x19] = uVar25;
              auVar29[0x1a] = uVar25;
              auVar29[0x1b] = uVar25;
              auVar29[0x1c] = uVar25;
              auVar29[0x1d] = uVar25;
              auVar29[0x1e] = uVar25;
              auVar29[0x1f] = uVar25;
              uVar25 = (undefined1)gap;
              auVar30[1] = uVar25;
              auVar30[0] = uVar25;
              auVar30[2] = uVar25;
              auVar30[3] = uVar25;
              auVar30[4] = uVar25;
              auVar30[5] = uVar25;
              auVar30[6] = uVar25;
              auVar30[7] = uVar25;
              auVar30[8] = uVar25;
              auVar30[9] = uVar25;
              auVar30[10] = uVar25;
              auVar30[0xb] = uVar25;
              auVar30[0xc] = uVar25;
              auVar30[0xd] = uVar25;
              auVar30[0xe] = uVar25;
              auVar30[0xf] = uVar25;
              auVar30[0x10] = uVar25;
              auVar30[0x11] = uVar25;
              auVar30[0x12] = uVar25;
              auVar30[0x13] = uVar25;
              auVar30[0x14] = uVar25;
              auVar30[0x15] = uVar25;
              auVar30[0x16] = uVar25;
              auVar30[0x17] = uVar25;
              auVar30[0x18] = uVar25;
              auVar30[0x19] = uVar25;
              auVar30[0x1a] = uVar25;
              auVar30[0x1b] = uVar25;
              auVar30[0x1c] = uVar25;
              auVar30[0x1d] = uVar25;
              auVar30[0x1e] = uVar25;
              auVar30[0x1f] = uVar25;
              cVar12 = (char)uVar16 + -0x7f;
              auVar26[1] = cVar12;
              auVar26[0] = cVar12;
              auVar26[2] = cVar12;
              auVar26[3] = cVar12;
              auVar26[4] = cVar12;
              auVar26[5] = cVar12;
              auVar26[6] = cVar12;
              auVar26[7] = cVar12;
              auVar26[8] = cVar12;
              auVar26[9] = cVar12;
              auVar26[10] = cVar12;
              auVar26[0xb] = cVar12;
              auVar26[0xc] = cVar12;
              auVar26[0xd] = cVar12;
              auVar26[0xe] = cVar12;
              auVar26[0xf] = cVar12;
              auVar27[0x10] = cVar12;
              auVar27._0_16_ = auVar26;
              auVar27[0x11] = cVar12;
              auVar27[0x12] = cVar12;
              auVar27[0x13] = cVar12;
              auVar27[0x14] = cVar12;
              auVar27[0x15] = cVar12;
              auVar27[0x16] = cVar12;
              auVar27[0x17] = cVar12;
              auVar27[0x18] = cVar12;
              auVar27[0x19] = cVar12;
              auVar27[0x1a] = cVar12;
              auVar27[0x1b] = cVar12;
              auVar27[0x1c] = cVar12;
              auVar27[0x1d] = cVar12;
              auVar27[0x1e] = cVar12;
              auVar27[0x1f] = cVar12;
              auVar28[1] = cVar5;
              auVar28[0] = cVar5;
              auVar28[2] = cVar5;
              auVar28[3] = cVar5;
              auVar28[4] = cVar5;
              auVar28[5] = cVar5;
              auVar28[6] = cVar5;
              auVar28[7] = cVar5;
              auVar28[8] = cVar5;
              auVar28[9] = cVar5;
              auVar28[10] = cVar5;
              auVar28[0xb] = cVar5;
              auVar28[0xc] = cVar5;
              auVar28[0xd] = cVar5;
              auVar28[0xe] = cVar5;
              auVar28[0xf] = cVar5;
              auVar28[0x10] = cVar5;
              auVar28[0x11] = cVar5;
              auVar28[0x12] = cVar5;
              auVar28[0x13] = cVar5;
              auVar28[0x14] = cVar5;
              auVar28[0x15] = cVar5;
              auVar28[0x16] = cVar5;
              auVar28[0x17] = cVar5;
              auVar28[0x18] = cVar5;
              auVar28[0x19] = cVar5;
              auVar28[0x1a] = cVar5;
              auVar28[0x1b] = cVar5;
              auVar28[0x1c] = cVar5;
              auVar28[0x1d] = cVar5;
              auVar28[0x1e] = cVar5;
              auVar28[0x1f] = cVar5;
              lVar18 = (long)iVar9;
              uVar20 = 0;
              do {
                lVar17 = 0;
                lVar14 = lVar18;
                do {
                  uVar25 = 0x80;
                  if (-0x80 < lVar14) {
                    uVar25 = (undefined1)lVar14;
                  }
                  *(undefined1 *)((long)&local_80 + lVar17) = uVar25;
                  lVar21 = lVar14 - (ulong)(uint)open;
                  if (lVar21 < -0x7f) {
                    lVar21 = -0x80;
                  }
                  *(char *)((long)&local_a0 + lVar17) = (char)lVar21;
                  lVar17 = lVar17 + 1;
                  lVar14 = lVar14 - size * (uint)gap;
                } while (lVar17 != 0x20);
                palVar23 = ptr + uVar20;
                (*palVar23)[0] = local_80;
                (*palVar23)[1] = lStack_78;
                (*palVar23)[2] = lStack_70;
                (*palVar23)[3] = lStack_68;
                palVar23 = ptr_00 + uVar20;
                (*palVar23)[0] = local_a0;
                (*palVar23)[1] = lStack_98;
                (*palVar23)[2] = lStack_90;
                (*palVar23)[3] = lStack_88;
                uVar20 = uVar20 + 1;
                lVar18 = lVar18 - (ulong)(uint)gap;
              } while (uVar20 != size);
              *ptr_01 = '\0';
              uVar20 = 1;
              do {
                iVar13 = -0x80;
                if (-0x80 < iVar9) {
                  iVar13 = (int8_t)iVar9;
                }
                ptr_01[uVar20] = iVar13;
                uVar20 = uVar20 + 1;
                iVar9 = iVar9 - gap;
              } while (s2Len + 1 != uVar20);
              uVar20 = 1;
              if (1 < s2Len) {
                uVar20 = (ulong)(uint)s2Len;
              }
              lVar18 = (ulong)(iVar22 + (uint)(iVar22 == 0)) << 5;
              uVar19 = 0;
              auVar31 = ZEXT3264(auVar27);
              auVar32 = ZEXT3264(auVar28);
              do {
                palVar23 = ptr;
                ptr = palVar8;
                auVar33 = SUB3216(palVar23[iVar22 - 1],0);
                auVar36._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar26;
                auVar36._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar33;
                auVar36 = vpalignr_avx2((undefined1  [32])palVar23[iVar22 - 1],auVar36,0xf);
                iVar9 = ppVar3->mapper[(byte)s2[uVar19]];
                auVar33 = vpinsrb_avx(auVar36._0_16_,(uint)(byte)ptr_01[uVar19],0);
                auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar33),0xf);
                lVar14 = 0;
                auVar35 = ZEXT3264(auVar27);
                do {
                  auVar37 = vpaddsb_avx2(auVar36,*(undefined1 (*) [32])
                                                  ((long)pvVar2 + lVar14 + size * (long)iVar9 * 0x20
                                                  ));
                  auVar36 = *(undefined1 (*) [32])((long)*ptr_00 + lVar14);
                  auVar34 = auVar35._0_32_;
                  auVar4 = vpmaxsb_avx2(auVar36,auVar34);
                  auVar37 = vpmaxsb_avx2(auVar37,auVar4);
                  *(undefined1 (*) [32])((long)*ptr + lVar14) = auVar37;
                  auVar4 = vpmaxsb_avx2(auVar31._0_32_,auVar37);
                  auVar31 = ZEXT3264(auVar4);
                  auVar4 = vpminsb_avx2(auVar32._0_32_,auVar36);
                  auVar4 = vpminsb_avx2(auVar4,auVar34);
                  auVar4 = vpminsb_avx2(auVar4,auVar37);
                  auVar32 = ZEXT3264(auVar4);
                  auVar37 = vpsubsb_avx2(auVar37,auVar29);
                  auVar36 = vpsubsb_avx2(auVar36,auVar30);
                  auVar36 = vpmaxsb_avx2(auVar36,auVar37);
                  *(undefined1 (*) [32])((long)*ptr_00 + lVar14) = auVar36;
                  auVar36 = vpsubsb_avx2(auVar34,auVar30);
                  auVar36 = vpmaxsb_avx2(auVar36,auVar37);
                  auVar35 = ZEXT3264(auVar36);
                  auVar36 = *(undefined1 (*) [32])((long)*palVar23 + lVar14);
                  lVar14 = lVar14 + 0x20;
                } while (lVar18 != lVar14);
                uVar16 = 0;
                do {
                  iVar9 = ptr_01[uVar19 + 1] - open;
                  if (iVar9 < -0x7f) {
                    iVar9 = -0x80;
                  }
                  auVar37._0_16_ = ZEXT116(0) * auVar35._0_16_ + ZEXT116(1) * auVar26;
                  auVar37._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar35._0_16_;
                  auVar36 = vpalignr_avx2(auVar35._0_32_,auVar37,0xf);
                  auVar33 = vpinsrb_avx(auVar36._0_16_,iVar9,0);
                  auVar36 = vpblendd_avx2(auVar36,ZEXT1632(auVar33),0xf);
                  auVar35 = ZEXT3264(auVar36);
                  bVar24 = true;
                  uVar15 = 1;
                  lVar14 = 0;
                  do {
                    auVar36 = vpmaxsb_avx2(auVar35._0_32_,
                                           *(undefined1 (*) [32])((long)*ptr + lVar14));
                    *(undefined1 (*) [32])((long)*ptr + lVar14) = auVar36;
                    auVar4 = vpminsb_avx2(auVar32._0_32_,auVar36);
                    auVar32 = ZEXT3264(auVar4);
                    auVar37 = vpmaxsb_avx2(auVar31._0_32_,auVar36);
                    auVar31 = ZEXT3264(auVar37);
                    auVar36 = vpsubsb_avx2(auVar36,auVar29);
                    auVar34 = vpsubsb_avx2(auVar35._0_32_,auVar30);
                    auVar35 = ZEXT3264(auVar34);
                    auVar36 = vpcmpgtb_avx2(auVar34,auVar36);
                    if ((((((((((((((((((((((((((((((((auVar36 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar36 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar36 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar36 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar36 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar36 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar36 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar36 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar36 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar36 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar36 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar36 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar36 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar36 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar36 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar36 >> 0x7f,0) == '\0')
                                      && (auVar36 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar36 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar36 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar36 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar36 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar36 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar36 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar36 >> 0xbf,0) == '\0') &&
                              (auVar36 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar36 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar36 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar36 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar36 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar36 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar36 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar36[0x1f]) break;
                    bVar24 = uVar15 < size;
                    lVar14 = lVar14 + 0x20;
                    uVar15 = uVar15 + 1;
                  } while (lVar18 != lVar14);
                } while ((!bVar24) && (bVar24 = uVar16 < 0x1f, uVar16 = uVar16 + 1, bVar24));
                uVar19 = uVar19 + 1;
                palVar8 = palVar23;
                if (uVar19 == uVar20) {
                  alVar1 = ptr[(uint)(iVar6 % iVar22)];
                  cVar5 = alVar1[2]._7_1_;
                  if (iVar6 / iVar22 < 0x1f) {
                    iVar9 = 1;
                    if (1 < iVar11) {
                      iVar9 = iVar11;
                    }
                    do {
                      auVar29 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                0x28);
                      alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar29,0xf);
                      cVar5 = alVar1[2]._7_1_;
                      iVar9 = iVar9 + -1;
                    } while (iVar9 != 0);
                  }
                  auVar27 = vpcmpgtb_avx2(auVar27,auVar4);
                  auVar28 = vpcmpgtb_avx2(auVar37,auVar28);
                  auVar27 = vpor_avx2(auVar28,auVar27);
                  if ((((((((((((((((((((((((((((((((auVar27 >> 7 & (undefined1  [32])0x1) !=
                                                    (undefined1  [32])0x0 ||
                                                   (auVar27 >> 0xf & (undefined1  [32])0x1) !=
                                                   (undefined1  [32])0x0) ||
                                                  (auVar27 >> 0x17 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0) ||
                                                 (auVar27 >> 0x1f & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar27 >> 0x27 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar27 >> 0x2f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar27 >> 0x37 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar27 >> 0x3f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar27 >> 0x47 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar27 >> 0x4f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar27 >> 0x57 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar27 >> 0x5f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar27 >> 0x67 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar27 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar27 >> 0x77 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar27 >> 0x7f,0) != '\0')
                                    || (auVar27 >> 0x87 & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                   (auVar27 >> 0x8f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar27 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar27 >> 0x9f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar27 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar27 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar27 >> 0xb7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar27 >> 0xbf,0) != '\0') ||
                            (auVar27 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar27 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar27 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar27 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar27 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      auVar27[0x1f] < '\0') {
                    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
                    cVar5 = '\0';
                    iVar10 = 0;
                    iVar6 = 0;
                  }
                  ppVar7->score = (int)cVar5;
                  ppVar7->end_query = iVar6;
                  ppVar7->end_ref = iVar10;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(palVar23);
                  parasail_free(ptr);
                  return ppVar7;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad  = parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int8_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_8_t h;
            __m256i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi8(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi8(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 1);
        }
        score = (int8_t) _mm256_extract_epi8_rpl (vH, 31);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi8_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}